

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::_::SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_1UL>_>
__thiscall
kj::
heap<kj::_::SplitBranch<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>,1ul>,kj::Own<kj::_::ForkHub<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>>>>
          (kj *this,
          Own<kj::_::ForkHub<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_>_>
          *params)

{
  SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_1UL> *this_00;
  SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_1UL> *extraout_RDX;
  Own<kj::_::SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_1UL>_>
  OVar1;
  Own<kj::_::ForkHubBase> local_28;
  
  this_00 = (SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_1UL> *)
            operator_new(0x30);
  local_28.disposer = params->disposer;
  local_28.ptr = &params->ptr->super_ForkHubBase;
  params->ptr = (ForkHub<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> *)0x0;
  _::SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_1UL>::SplitBranch
            (this_00,&local_28);
  *(undefined8 **)this =
       &_::
        HeapDisposer<kj::_::SplitBranch<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>,1ul>>
        ::instance;
  *(SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_1UL> **)(this + 8) =
       this_00;
  Own<kj::_::ForkHubBase>::dispose(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}